

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_crusader.cpp
# Opt level: O0

int AF_A_CrusaderSweepLeft(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  AActor *dest;
  PClassActor *type;
  AActor *pAVar1;
  bool bVar2;
  double dVar3;
  bool local_56;
  bool local_53;
  AActor *misl;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                  ,0x36,
                  "int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    pAVar1 = (AActor *)(param->field_0).field_1.a;
    local_53 = true;
    if (pAVar1 != (AActor *)0x0) {
      local_53 = DObject::IsKindOf((DObject *)pAVar1,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
          bVar2 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                        ,0x36,
                        "int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_56 = true;
        if (this != (DObject *)0x0) {
          local_56 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_56 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                        ,0x36,
                        "int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
          bVar2 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                        ,0x36,
                        "int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      TAngle<double>::operator+=(&(pAVar1->Angles).Yaw,5.625);
      dVar3 = AActor::Z(pAVar1);
      dest = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pAVar1->target);
      type = PClass::FindActor("FastFlameMissile");
      pAVar1 = P_SpawnMissileZAimed(pAVar1,dVar3 + 48.0,dest,type);
      if (pAVar1 != (AActor *)0x0) {
        (pAVar1->Vel).Z = (pAVar1->Vel).Z + 1.0;
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                  ,0x36,
                  "int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                ,0x36,"int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CrusaderSweepLeft)
{
	PARAM_ACTION_PROLOGUE;

	self->Angles.Yaw += 90./16;
	AActor *misl = P_SpawnMissileZAimed (self, self->Z() + 48, self->target, PClass::FindActor("FastFlameMissile"));
	if (misl != NULL)
	{
		misl->Vel.Z += 1;
	}
	return 0;
}